

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall Frame::findAttributes(Frame *this)

{
  cp_info *str;
  attribute_info *paVar1;
  u1 *puVar2;
  Code_attribute *pCVar3;
  bool bVar4;
  cp_info **ppcVar5;
  ulong uVar6;
  cp_info *str_00;
  uint uVar7;
  int i;
  ulong uVar8;
  long lVar9;
  CONSTANT_Utf8_info constant;
  CONSTANT_Utf8_info constant_00;
  
  ppcVar5 = getConstantPool(this);
  str = *ppcVar5;
  this->_codeAttribute = (Code_attribute *)0x0;
  this->_exceptionsAttribute = (Exceptions_attribute *)0x0;
  lVar9 = 8;
  uVar8 = 0;
  do {
    if ((this->_method).attributes_count <= uVar8) {
      return;
    }
    paVar1 = (this->_method).attributes;
    uVar6 = (ulong)*(ushort *)((long)paVar1 + lVar9 + -8);
    puVar2 = str[uVar6 - 1].info.utf8_info.bytes;
    uVar7 = (uint)str[uVar6 - 1].info.fieldref_info.class_index;
    constant.bytes = (u1 *)"Code";
    constant._0_8_ = puVar2;
    str_00 = str;
    bVar4 = Utils::compareUtf8WithString((Utils *)(ulong)uVar7,constant,(char *)str);
    if (bVar4) {
      this->_codeAttribute = (Code_attribute *)((long)&paVar1->attribute_name_index + lVar9);
      pCVar3 = (Code_attribute *)this->_exceptionsAttribute;
joined_r0x00115219:
      if (pCVar3 != (Code_attribute *)0x0) {
        return;
      }
    }
    else {
      constant_00.bytes = (u1 *)"Exceptions";
      constant_00._0_8_ = puVar2;
      bVar4 = Utils::compareUtf8WithString((Utils *)(ulong)uVar7,constant_00,(char *)str_00);
      if (bVar4) {
        this->_exceptionsAttribute =
             (Exceptions_attribute *)((long)&paVar1->attribute_name_index + lVar9);
        pCVar3 = this->_codeAttribute;
        goto joined_r0x00115219;
      }
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x38;
  } while( true );
}

Assistant:

void Frame::findAttributes() {
    cp_info *constantPool = *getConstantPool();
    
    _codeAttribute = NULL;
    _exceptionsAttribute = NULL;
    
    for (int i = 0; i < _method.attributes_count; i++) {
        attribute_info *attr = &(_method.attributes[i]);
        CONSTANT_Utf8_info attrName = constantPool[attr->attribute_name_index-1].info.utf8_info;
        
        if (Utils::compareUtf8WithString(attrName, "Code")) {
            _codeAttribute = &(attr->info.code_info);
            if (_exceptionsAttribute != NULL) break;
        } else if (Utils::compareUtf8WithString(attrName, "Exceptions")) {
            _exceptionsAttribute = &(attr->info.exceptions_info);
            if (_codeAttribute != NULL) break;
        }
    }
}